

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::FragmentOutputCase::deinit(FragmentOutputCase *this)

{
  pointer puVar1;
  pointer puVar2;
  ShaderProgram *this_00;
  int iVar3;
  undefined4 extraout_var;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_framebuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x440))(1,&this->m_framebuffer);
    this->m_framebuffer = 0;
  }
  puVar1 = (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x460))((ulong)((long)puVar2 - (long)puVar1) >> 2);
    puVar1 = (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void FragmentOutputCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_framebuffer)
	{
		gl.deleteFramebuffers(1, &m_framebuffer);
		m_framebuffer = 0;
	}

	if (!m_renderbuffers.empty())
	{
		gl.deleteRenderbuffers((int)m_renderbuffers.size(), &m_renderbuffers[0]);
		m_renderbuffers.clear();
	}

	delete m_program;
	m_program = DE_NULL;
}